

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O0

CollationKey * __thiscall icu_63::CollationKey::operator=(CollationKey *this,CollationKey *other)

{
  UBool UVar1;
  uint newCapacity;
  int32_t iVar2;
  uint8_t *puVar3;
  uint8_t *__src;
  int32_t length;
  CollationKey *other_local;
  CollationKey *this_local;
  
  this_local = this;
  if (this != other) {
    UVar1 = isBogus(other);
    if (UVar1 == '\0') {
      newCapacity = getLength(other);
      iVar2 = getCapacity(this);
      if ((iVar2 < (int)newCapacity) &&
         (puVar3 = reallocate(this,newCapacity,0), puVar3 == (uint8_t *)0x0)) {
        this_local = setToBogus(this);
      }
      else {
        if (0 < (int)newCapacity) {
          puVar3 = getBytes(this);
          __src = getBytes(other);
          memcpy(puVar3,__src,(long)(int)newCapacity);
        }
        this->fFlagAndLength = this->fFlagAndLength & 0x80000000U | newCapacity;
        this->fHashCode = other->fHashCode;
      }
    }
    else {
      this_local = setToBogus(this);
    }
  }
  return this_local;
}

Assistant:

const CollationKey&
CollationKey::operator=(const CollationKey& other)
{
    if (this != &other)
    {
        if (other.isBogus())
        {
            return setToBogus();
        }

        int32_t length = other.getLength();
        if (length > getCapacity() && reallocate(length, 0) == NULL) {
            return setToBogus();
        }
        if (length > 0) {
            uprv_memcpy(getBytes(), other.getBytes(), length);
        }
        fFlagAndLength = (fFlagAndLength & 0x80000000) | length;
        fHashCode = other.fHashCode;
    }

    return *this;
}